

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O2

CURLcode Curl_proxyCONNECT(connectdata *conn,int sockindex,char *hostname,int remote_port,
                          _Bool blocking)

{
  int *piVar1;
  long *plVar2;
  curl_socket_t sockfd;
  Curl_easy *data;
  bool bVar3;
  bool bVar4;
  _Bool _Var5;
  anon_enum_32 aVar6;
  CURLcode CVar7;
  CURLcode CVar8;
  int iVar9;
  CHUNKcode CVar10;
  Curl_send_buffer *buff;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  time_t tVar14;
  ulong timeout_ms;
  long lVar15;
  undefined8 extraout_RAX;
  char *pcVar16;
  char *pcVar17;
  char *pcVar18;
  char *pcVar19;
  char cVar20;
  uint local_ac;
  char *local_a8;
  ulong local_98;
  long local_88;
  size_t local_78;
  int subversion;
  ulong local_58;
  char *local_50;
  ssize_t gotbytes;
  long *local_40;
  ssize_t tookcareof;
  
  subversion = 0;
  aVar6 = conn->tunnel_state[sockindex];
  if (aVar6 == TUNNEL_COMPLETE) {
LAB_001364ec:
    CVar7 = CURLE_OK;
  }
  else {
    data = conn->data;
    sockfd = conn->sock[sockindex];
    (conn->bits).proxy_connect_closed = false;
    local_40 = &(data->info).request_size;
    piVar1 = &(data->req).httpcode;
    local_58 = 0;
    local_88 = 0;
    local_50 = hostname;
LAB_00136546:
    pcVar11 = local_50;
    if (aVar6 != TUNNEL_INIT) {
LAB_001367db:
      tVar14 = Curl_timeleft(data,(timeval *)0x0,true);
      if (tVar14 < 1) {
        Curl_failf(data,"Proxy CONNECT aborted due to timeout");
        return CURLE_RECV_ERROR;
      }
      if ((blocking) || (_Var5 = Curl_conn_data_pending(conn,sockindex), _Var5)) {
        local_98 = 0;
        bVar3 = false;
LAB_00136815:
        do {
          bVar4 = bVar3;
          pcVar11 = (data->state).buffer;
          local_78 = 0;
          local_ac = 1;
          local_a8 = pcVar11;
LAB_00136836:
LAB_0013684e:
          if (local_ac == 0 || 0x3fff < local_98) {
            bVar3 = false;
            goto LAB_00136d5a;
          }
          iVar9 = Curl_pgrsUpdate(conn);
          if (iVar9 != 0) {
            return CURLE_ABORTED_BY_CALLBACK;
          }
          if ((data->state).buffer + 0x4000 <= pcVar11) {
            Curl_failf(data,"CONNECT response too large!");
            return CURLE_RECV_ERROR;
          }
          timeout_ms = Curl_timeleft(data,(timeval *)0x0,true);
          if ((long)timeout_ms < 1) {
            pcVar11 = "Proxy CONNECT aborted due to timeout";
            goto LAB_00136cf9;
          }
          CVar7 = Curl_read(conn,sockfd,pcVar11,1,&gotbytes);
          if (CVar7 == CURLE_AGAIN) goto code_r0x001368b6;
          if (CVar7 != CURLE_OK) {
LAB_00136d57:
            bVar3 = false;
LAB_00136d5a:
            iVar9 = Curl_pgrsUpdate(conn);
            if ((bVar3) || (iVar9 != 0)) {
              if (iVar9 != 0) {
                return CURLE_ABORTED_BY_CALLBACK;
              }
              return CURLE_RECV_ERROR;
            }
            if ((data->info).httpproxycode != 200) {
              CVar7 = Curl_http_auth_act(conn);
              if (CVar7 != CURLE_OK) {
                return CVar7;
              }
              if ((conn->bits).close != false) {
                bVar4 = true;
              }
            }
            pcVar11 = (data->req).newurl;
            if (bVar4) {
              if (pcVar11 != (char *)0x0) {
                Curl_closesocket(conn,conn->sock[sockindex]);
                conn->sock[sockindex] = -1;
              }
            }
            else if (pcVar11 != (char *)0x0) {
              aVar6 = conn->tunnel_state[sockindex];
              if (aVar6 != TUNNEL_COMPLETE) goto LAB_00136546;
              conn->tunnel_state[sockindex] = TUNNEL_INIT;
              Curl_infof(data,"TUNNEL_STATE switched to: %d\n",0);
              if ((data->req).newurl != (char *)0x0) {
                aVar6 = conn->tunnel_state[sockindex];
                goto LAB_00136546;
              }
            }
            if (*piVar1 == 200) {
              conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;
              (*Curl_cfree)((conn->allocptr).proxyuserpwd);
              (conn->allocptr).proxyuserpwd = (char *)0x0;
              (data->state).authproxy.done = true;
              Curl_infof(data,"Proxy replied OK to CONNECT request\n");
              (data->req).ignorebody = false;
              (conn->bits).rewindaftersend = false;
              return CURLE_OK;
            }
            pcVar11 = (data->req).newurl;
            if ((bool)(bVar4 & pcVar11 != (char *)0x0)) {
              (conn->bits).proxy_connect_closed = true;
              Curl_infof(data,"Connect me again please\n");
            }
            else {
              (*Curl_cfree)(pcVar11);
              (data->req).newurl = (char *)0x0;
              Curl_conncontrol(conn,2);
              Curl_closesocket(conn,conn->sock[sockindex]);
              conn->sock[sockindex] = -1;
            }
            conn->tunnel_state[sockindex] = TUNNEL_INIT;
            if ((conn->bits).proxy_connect_closed == false) {
              Curl_failf(data,"Received HTTP code %d from proxy after CONNECT",
                         (ulong)(uint)(data->req).httpcode);
              return CURLE_RECV_ERROR;
            }
            break;
          }
          if (gotbytes < 1) {
            if (((data->set).proxyauth == 0) || ((data->state).authproxy.avail == 0)) {
              Curl_failf(data,"Proxy CONNECT aborted");
              bVar3 = true;
            }
            else {
              (conn->bits).proxy_connect_closed = true;
              bVar3 = false;
              Curl_infof(data,"Proxy CONNECT connection closed\n");
            }
            goto LAB_00136d5a;
          }
          if (1 < local_ac) {
            pcVar11 = (data->state).buffer;
            if (local_88 == 0) {
              tookcareof = 0;
              CVar10 = Curl_httpchunk_read(conn,pcVar11,1,&tookcareof);
              local_ac = 2;
              if (CVar10 == CHUNKE_STOP) {
                local_ac = 0;
                Curl_infof(data,"chunk reading DONE\n");
                conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;
              }
              local_98 = 0;
              local_88 = 0;
            }
            else {
              lVar15 = local_88 + -1;
              local_98 = 0;
              local_ac = 2;
              bVar3 = local_88 < 2;
              local_88 = lVar15;
              if (bVar3) goto LAB_00136d57;
            }
            goto LAB_00136836;
          }
          local_98 = local_98 + 1;
          local_78 = (long)(int)local_78 + 1;
          if (*pcVar11 != '\n') {
            pcVar11 = pcVar11 + 1;
            local_ac = 1;
            goto LAB_00136836;
          }
          if ((data->set).verbose == true) {
            Curl_debug(data,CURLINFO_HEADER_IN,local_a8,local_78,conn);
          }
          CVar7 = Curl_client_write(conn,(data->set).include_header | 2,local_a8,local_78);
          plVar2 = &(data->info).header_size;
          *plVar2 = *plVar2 + local_78;
          plVar2 = &(data->req).headerbytecount;
          *plVar2 = *plVar2 + local_78;
          if (CVar7 != CURLE_OK) {
            return CVar7;
          }
          if ((*local_a8 == '\r') || (*local_a8 == '\n')) {
            pcVar11 = (data->state).buffer;
            local_ac = 0;
            if (((data->req).httpcode == 0x197) && ((data->state).authproblem == false)) {
              if (local_88 == 0) {
                if ((local_58 & 1) != 0) {
                  Curl_infof(data,"Ignore chunked response-body\n");
                  (data->req).ignorebody = true;
                  if (local_a8[1] == '\n') {
                    local_a8 = local_a8 + 1;
                  }
                  CVar10 = Curl_httpchunk_read(conn,local_a8 + 1,1,&gotbytes);
                  if (CVar10 != CHUNKE_STOP) goto LAB_00136a82;
                  local_ac = 0;
                  Curl_infof(data,"chunk reading DONE\n");
                }
              }
              else {
                Curl_infof(data,"Ignore %lld bytes of response-body\n",local_88);
LAB_00136a82:
                local_ac = 2;
              }
            }
            conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;
            local_98 = 0;
            goto LAB_00136836;
          }
          local_a8[local_78] = '\0';
          iVar9 = curl_strnequal("WWW-Authenticate:",local_a8,0x11);
          bVar3 = bVar4;
          if ((iVar9 != 0) && (*piVar1 == 0x191)) {
            _Var5 = false;
LAB_00136b6b:
            pcVar11 = Curl_copy_header_value(local_a8);
            if (pcVar11 == (char *)0x0) {
              return CURLE_OUT_OF_MEMORY;
            }
            CVar7 = Curl_http_input_auth(conn,_Var5,pcVar11);
            (*Curl_cfree)(pcVar11);
            if (CVar7 != CURLE_OK) {
              return CVar7;
            }
            goto LAB_00136815;
          }
          iVar9 = curl_strnequal("Proxy-authenticate:",local_a8,0x13);
          if ((iVar9 != 0) && (_Var5 = true, *piVar1 == 0x197)) goto LAB_00136b6b;
          iVar9 = curl_strnequal("Content-Length:",local_a8,0xf);
          if (iVar9 == 0) {
            _Var5 = Curl_compareheader(local_a8,"Connection:","close");
            bVar3 = true;
            if (!_Var5) {
              _Var5 = Curl_compareheader(local_a8,"Transfer-Encoding:","chunked");
              if (_Var5) {
                if (*piVar1 - 200U < 100) {
                  pcVar11 = "Transfer-Encoding: in %03d response";
LAB_00136faf:
                  Curl_failf(data,pcVar11);
                  return CURLE_RECV_ERROR;
                }
                Curl_infof(data,"CONNECT responded chunked\n");
                Curl_httpchunk_init(conn);
                local_58 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
                bVar3 = bVar4;
              }
              else {
                _Var5 = Curl_compareheader(local_a8,"Proxy-Connection:","close");
                bVar3 = true;
                if ((!_Var5) &&
                   (iVar9 = __isoc99_sscanf(local_a8,"HTTP/1.%d %d",&subversion,piVar1),
                   bVar3 = bVar4, iVar9 == 2)) {
                  (data->info).httpproxycode = (data->req).httpcode;
                }
              }
            }
          }
          else {
            if (*piVar1 - 200U < 100) {
              pcVar11 = "Content-Length: in %03d response";
              goto LAB_00136faf;
            }
            local_88 = strtol(local_a8 + 0xf,(char **)0x0,10);
          }
        } while( true );
      }
      goto LAB_001364ec;
    }
    Curl_infof(data,"Establish HTTP proxy tunnel to %s:%hu\n",local_50,(ulong)(uint)remote_port);
    (*Curl_cfree)((data->req).newurl);
    (data->req).newurl = (char *)0x0;
    buff = Curl_add_buffer_init();
    if (buff != (Curl_send_buffer *)0x0) {
      pcVar11 = curl_maprintf("%s:%hu",pcVar11,(ulong)(uint)remote_port);
      if (pcVar11 != (char *)0x0) {
        CVar7 = Curl_http_output_auth(conn,"CONNECT",pcVar11,true);
        (*Curl_cfree)(pcVar11);
        pcVar11 = local_50;
        if (CVar7 == CURLE_OK) {
          pcVar17 = "1.1";
          if ((conn->http_proxy).proxytype == CURLPROXY_HTTP_1_0) {
            pcVar17 = "1.0";
          }
          if ((conn->host).name == local_50) {
            cVar20 = (conn->bits).ipv6_ip;
          }
          else {
            pcVar12 = strchr(local_50,0x3a);
            cVar20 = pcVar12 != (char *)0x0;
          }
          pcVar16 = "";
          pcVar12 = "";
          if (cVar20 != '\0') {
            pcVar12 = "[";
            pcVar16 = "]";
          }
          pcVar11 = curl_maprintf("%s%s%s:%hu",pcVar12,pcVar11,pcVar16,(ulong)(uint)remote_port);
          if (pcVar11 == (char *)0x0) goto LAB_00136f8f;
          pcVar12 = Curl_checkProxyheaders(conn,"Host:");
          if (pcVar12 == (char *)0x0) {
            pcVar12 = curl_maprintf("Host: %s\r\n",pcVar11);
            if (pcVar12 == (char *)0x0) {
              (*Curl_cfree)(pcVar11);
              goto LAB_00136f8f;
            }
          }
          else {
            pcVar12 = (char *)0x0;
          }
          pcVar16 = Curl_checkProxyheaders(conn,"Proxy-Connection:");
          pcVar19 = "";
          if (pcVar16 == (char *)0x0) {
            pcVar19 = "Proxy-Connection: Keep-Alive\r\n";
          }
          pcVar13 = Curl_checkProxyheaders(conn,"User-Agent:");
          pcVar16 = "";
          if ((pcVar13 == (char *)0x0) && (pcVar16 = "", (data->set).str[0x24] != (char *)0x0)) {
            pcVar16 = (conn->allocptr).uagent;
          }
          pcVar13 = pcVar12;
          if (pcVar12 == (char *)0x0) {
            pcVar13 = "";
          }
          pcVar18 = (conn->allocptr).proxyuserpwd;
          if (pcVar18 == (char *)0x0) {
            pcVar18 = "";
          }
          CVar8 = Curl_add_bufferf(buff,"CONNECT %s HTTP/%s\r\n%s%s%s%s",pcVar11,pcVar17,pcVar13,
                                   pcVar18,pcVar16,pcVar19);
          if (pcVar12 != (char *)0x0) {
            (*Curl_cfree)(pcVar12);
          }
          (*Curl_cfree)(pcVar11);
          if (((CVar8 == CURLE_OK) &&
              (CVar8 = Curl_add_custom_headers(conn,true,buff), CVar8 == CURLE_OK)) &&
             (CVar8 = Curl_add_bufferf(buff,"\r\n"), CVar8 == CURLE_OK)) {
            CVar8 = Curl_add_buffer_send(buff,conn,local_40,0,sockindex);
            buff = (Curl_send_buffer *)0x0;
            CVar7 = CURLE_OK;
            if (CVar8 == CURLE_OK) goto LAB_001367bb;
          }
          Curl_failf(data,"Failed sending CONNECT to proxy");
          buff = (Curl_send_buffer *)0x0;
          CVar7 = CVar8;
        }
LAB_001367bb:
        Curl_add_buffer_free(buff);
        if (CVar7 != CURLE_OK) {
          return CVar7;
        }
        conn->tunnel_state[sockindex] = TUNNEL_CONNECT;
        goto LAB_001367db;
      }
LAB_00136f8f:
      Curl_add_buffer_free(buff);
    }
    CVar7 = CURLE_OUT_OF_MEMORY;
  }
  return CVar7;
code_r0x001368b6:
  if (999 < timeout_ms) {
    timeout_ms = 1000;
  }
  iVar9 = Curl_socket_check(sockfd,-1,-1,timeout_ms);
  if (iVar9 == -1) {
    pcVar11 = "Proxy CONNECT aborted due to select/poll error";
LAB_00136cf9:
    Curl_failf(data,pcVar11);
    bVar3 = true;
    goto LAB_00136d5a;
  }
  goto LAB_0013684e;
}

Assistant:

CURLcode Curl_proxyCONNECT(struct connectdata *conn,
                           int sockindex,
                           const char *hostname,
                           int remote_port,
                           bool blocking)
{
  int subversion=0;
  struct Curl_easy *data=conn->data;
  struct SingleRequest *k = &data->req;
  CURLcode result;
  curl_socket_t tunnelsocket = conn->sock[sockindex];
  curl_off_t cl=0;
  bool closeConnection = FALSE;
  bool chunked_encoding = FALSE;
  time_t check;

#define SELECT_OK      0
#define SELECT_ERROR   1
#define SELECT_TIMEOUT 2
  int error = SELECT_OK;

  if(conn->tunnel_state[sockindex] == TUNNEL_COMPLETE)
    return CURLE_OK; /* CONNECT is already completed */

  conn->bits.proxy_connect_closed = FALSE;

  do {
    if(TUNNEL_INIT == conn->tunnel_state[sockindex]) {
      /* BEGIN CONNECT PHASE */
      char *host_port;
      Curl_send_buffer *req_buffer;

      infof(data, "Establish HTTP proxy tunnel to %s:%hu\n",
            hostname, remote_port);

        /* This only happens if we've looped here due to authentication
           reasons, and we don't really use the newly cloned URL here
           then. Just free() it. */
      free(data->req.newurl);
      data->req.newurl = NULL;

      /* initialize a dynamic send-buffer */
      req_buffer = Curl_add_buffer_init();

      if(!req_buffer)
        return CURLE_OUT_OF_MEMORY;

      host_port = aprintf("%s:%hu", hostname, remote_port);
      if(!host_port) {
        Curl_add_buffer_free(req_buffer);
        return CURLE_OUT_OF_MEMORY;
      }

      /* Setup the proxy-authorization header, if any */
      result = Curl_http_output_auth(conn, "CONNECT", host_port, TRUE);

      free(host_port);

      if(!result) {
        char *host = NULL;
        const char *proxyconn="";
        const char *useragent="";
        const char *http = (conn->http_proxy.proxytype == CURLPROXY_HTTP_1_0) ?
          "1.0" : "1.1";
        bool ipv6_ip = conn->bits.ipv6_ip;
        char *hostheader;

        /* the hostname may be different */
        if(hostname != conn->host.name)
          ipv6_ip = (strchr(hostname, ':') != NULL);
        hostheader= /* host:port with IPv6 support */
          aprintf("%s%s%s:%hu", ipv6_ip?"[":"", hostname, ipv6_ip?"]":"",
                  remote_port);
        if(!hostheader) {
          Curl_add_buffer_free(req_buffer);
          return CURLE_OUT_OF_MEMORY;
        }

        if(!Curl_checkProxyheaders(conn, "Host:")) {
          host = aprintf("Host: %s\r\n", hostheader);
          if(!host) {
            free(hostheader);
            Curl_add_buffer_free(req_buffer);
            return CURLE_OUT_OF_MEMORY;
          }
        }
        if(!Curl_checkProxyheaders(conn, "Proxy-Connection:"))
          proxyconn = "Proxy-Connection: Keep-Alive\r\n";

        if(!Curl_checkProxyheaders(conn, "User-Agent:") &&
           data->set.str[STRING_USERAGENT])
          useragent = conn->allocptr.uagent;

        result =
          Curl_add_bufferf(req_buffer,
                           "CONNECT %s HTTP/%s\r\n"
                           "%s"  /* Host: */
                           "%s"  /* Proxy-Authorization */
                           "%s"  /* User-Agent */
                           "%s", /* Proxy-Connection */
                           hostheader,
                           http,
                           host?host:"",
                           conn->allocptr.proxyuserpwd?
                           conn->allocptr.proxyuserpwd:"",
                           useragent,
                           proxyconn);

        if(host)
          free(host);
        free(hostheader);

        if(!result)
          result = Curl_add_custom_headers(conn, TRUE, req_buffer);

        if(!result)
          /* CRLF terminate the request */
          result = Curl_add_bufferf(req_buffer, "\r\n");

        if(!result) {
          /* Send the connect request to the proxy */
          /* BLOCKING */
          result =
            Curl_add_buffer_send(req_buffer, conn,
                                 &data->info.request_size, 0, sockindex);
        }
        req_buffer = NULL;
        if(result)
          failf(data, "Failed sending CONNECT to proxy");
      }

      Curl_add_buffer_free(req_buffer);
      if(result)
        return result;

      conn->tunnel_state[sockindex] = TUNNEL_CONNECT;
    } /* END CONNECT PHASE */

    check = Curl_timeleft(data, NULL, TRUE);
    if(check <= 0) {
      failf(data, "Proxy CONNECT aborted due to timeout");
      return CURLE_RECV_ERROR;
    }

    if(!blocking) {
      if(!Curl_conn_data_pending(conn, sockindex))
        /* return so we'll be called again polling-style */
        return CURLE_OK;
      else {
        DEBUGF(infof(data,
               "Read response immediately from proxy CONNECT\n"));
      }
    }

    /* at this point, the tunnel_connecting phase is over. */

    { /* READING RESPONSE PHASE */
      size_t nread;   /* total size read */
      int perline; /* count bytes per line */
      int keepon=TRUE;
      ssize_t gotbytes;
      char *ptr;
      char *line_start;

      ptr = data->state.buffer;
      line_start = ptr;

      nread = 0;
      perline = 0;

      while(nread < BUFSIZE && keepon && !error) {
        int writetype;

        if(Curl_pgrsUpdate(conn))
          return CURLE_ABORTED_BY_CALLBACK;

        if(ptr >= &data->state.buffer[BUFSIZE]) {
          failf(data, "CONNECT response too large!");
          return CURLE_RECV_ERROR;
        }

        check = Curl_timeleft(data, NULL, TRUE);
        if(check <= 0) {
          failf(data, "Proxy CONNECT aborted due to timeout");
          error = SELECT_TIMEOUT; /* already too little time */
          break;
        }

        /* Read one byte at a time to avoid a race condition. Wait at most one
           second before looping to ensure continuous pgrsUpdates. */
        result = Curl_read(conn, tunnelsocket, ptr, 1, &gotbytes);
        if(result == CURLE_AGAIN) {
          if(SOCKET_READABLE(tunnelsocket, check<1000L?check:1000) == -1) {
            error = SELECT_ERROR;
            failf(data, "Proxy CONNECT aborted due to select/poll error");
            break;
          }
          continue;
        }
        else if(result) {
          keepon = FALSE;
          break;
        }
        else if(gotbytes <= 0) {
          if(data->set.proxyauth && data->state.authproxy.avail) {
            /* proxy auth was requested and there was proxy auth available,
               then deem this as "mere" proxy disconnect */
            conn->bits.proxy_connect_closed = TRUE;
            infof(data, "Proxy CONNECT connection closed\n");
          }
          else {
            error = SELECT_ERROR;
            failf(data, "Proxy CONNECT aborted");
          }
          keepon = FALSE;
          break;
        }

        /* We got a byte of data */
        nread++;

        if(keepon > TRUE) {
          /* This means we are currently ignoring a response-body */

          nread = 0; /* make next read start over in the read buffer */
          ptr = data->state.buffer;
          if(cl) {
            /* A Content-Length based body: simply count down the counter
               and make sure to break out of the loop when we're done! */
            cl--;
            if(cl <= 0) {
              keepon = FALSE;
              break;
            }
          }
          else {
            /* chunked-encoded body, so we need to do the chunked dance
               properly to know when the end of the body is reached */
            CHUNKcode r;
            ssize_t tookcareof = 0;

            /* now parse the chunked piece of data so that we can
               properly tell when the stream ends */
            r = Curl_httpchunk_read(conn, ptr, 1, &tookcareof);
            if(r == CHUNKE_STOP) {
              /* we're done reading chunks! */
              infof(data, "chunk reading DONE\n");
              keepon = FALSE;
              /* we did the full CONNECT treatment, go COMPLETE */
              conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;
            }
          }
          continue;
        }

        perline++; /* amount of bytes in this line so far */

        /* if this is not the end of a header line then continue */
        if(*ptr != 0x0a) {
          ptr++;
          continue;
        }

        /* convert from the network encoding */
        result = Curl_convert_from_network(data, line_start, perline);
        /* Curl_convert_from_network calls failf if unsuccessful */
        if(result)
          return result;

        /* output debug if that is requested */
        if(data->set.verbose)
          Curl_debug(data, CURLINFO_HEADER_IN,
                     line_start, (size_t)perline, conn);

        /* send the header to the callback */
        writetype = CLIENTWRITE_HEADER;
        if(data->set.include_header)
          writetype |= CLIENTWRITE_BODY;

        result = Curl_client_write(conn, writetype, line_start, perline);

        data->info.header_size += (long)perline;
        data->req.headerbytecount += (long)perline;

        if(result)
          return result;

        /* Newlines are CRLF, so the CR is ignored as the line isn't
           really terminated until the LF comes. Treat a following CR
           as end-of-headers as well.*/

        if(('\r' == line_start[0]) ||
           ('\n' == line_start[0])) {
          /* end of response-headers from the proxy */
          nread = 0; /* make next read start over in the read
                        buffer */
          ptr = data->state.buffer;
          if((407 == k->httpcode) && !data->state.authproblem) {
            /* If we get a 407 response code with content length
               when we have no auth problem, we must ignore the
               whole response-body */
            keepon = 2;

            if(cl) {
              infof(data, "Ignore %" CURL_FORMAT_CURL_OFF_T
                    " bytes of response-body\n", cl);
            }
            else if(chunked_encoding) {
              CHUNKcode r;

              infof(data, "Ignore chunked response-body\n");

              /* We set ignorebody true here since the chunked
                 decoder function will acknowledge that. Pay
                 attention so that this is cleared again when this
                 function returns! */
              k->ignorebody = TRUE;

              if(line_start[1] == '\n') {
                /* this can only be a LF if the letter at index 0
                   was a CR */
                line_start++;
              }

              /* now parse the chunked piece of data so that we can
                 properly tell when the stream ends */
              r = Curl_httpchunk_read(conn, line_start + 1, 1, &gotbytes);
              if(r == CHUNKE_STOP) {
                /* we're done reading chunks! */
                infof(data, "chunk reading DONE\n");
                keepon = FALSE;
                /* we did the full CONNECT treatment, go to
                   COMPLETE */
                conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;
              }
            }
            else {
              /* without content-length or chunked encoding, we
                 can't keep the connection alive since the close is
                 the end signal so we bail out at once instead */
              keepon = FALSE;
            }
          }
          else
            keepon = FALSE;
          /* we did the full CONNECT treatment, go to COMPLETE */
          conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;
          continue;
        }

        line_start[perline] = 0; /* zero terminate the buffer */
        if((checkprefix("WWW-Authenticate:", line_start) &&
            (401 == k->httpcode)) ||
           (checkprefix("Proxy-authenticate:", line_start) &&
            (407 == k->httpcode))) {

          bool proxy = (k->httpcode == 407) ? TRUE : FALSE;
          char *auth = Curl_copy_header_value(line_start);
          if(!auth)
            return CURLE_OUT_OF_MEMORY;

          result = Curl_http_input_auth(conn, proxy, auth);

          free(auth);

          if(result)
            return result;
        }
        else if(checkprefix("Content-Length:", line_start)) {
          if(k->httpcode/100 == 2) {
            /* A server MUST NOT send any Transfer-Encoding or
               Content-Length header fields in a 2xx (Successful)
               response to CONNECT. (RFC 7231 section 4.3.6) */
            failf(data, "Content-Length: in %03d response",
                  k->httpcode);
            return CURLE_RECV_ERROR;
          }

          cl = curlx_strtoofft(line_start +
                               strlen("Content-Length:"), NULL, 10);
        }
        else if(Curl_compareheader(line_start, "Connection:", "close"))
          closeConnection = TRUE;
        else if(Curl_compareheader(line_start,
                                   "Transfer-Encoding:",
                                   "chunked")) {
          if(k->httpcode/100 == 2) {
            /* A server MUST NOT send any Transfer-Encoding or
               Content-Length header fields in a 2xx (Successful)
               response to CONNECT. (RFC 7231 section 4.3.6) */
            failf(data, "Transfer-Encoding: in %03d response", k->httpcode);
            return CURLE_RECV_ERROR;
          }
          infof(data, "CONNECT responded chunked\n");
          chunked_encoding = TRUE;
          /* init our chunky engine */
          Curl_httpchunk_init(conn);
        }
        else if(Curl_compareheader(line_start, "Proxy-Connection:", "close"))
          closeConnection = TRUE;
        else if(2 == sscanf(line_start, "HTTP/1.%d %d",
                            &subversion,
                            &k->httpcode)) {
          /* store the HTTP code from the proxy */
          data->info.httpproxycode = k->httpcode;
        }

        perline = 0; /* line starts over here */
        ptr = data->state.buffer;
        line_start = ptr;
      } /* while there's buffer left and loop is requested */

      if(Curl_pgrsUpdate(conn))
        return CURLE_ABORTED_BY_CALLBACK;

      if(error)
        return CURLE_RECV_ERROR;

      if(data->info.httpproxycode != 200) {
        /* Deal with the possibly already received authenticate
           headers. 'newurl' is set to a new URL if we must loop. */
        result = Curl_http_auth_act(conn);
        if(result)
          return result;

        if(conn->bits.close)
          /* the connection has been marked for closure, most likely in the
             Curl_http_auth_act() function and thus we can kill it at once
             below */
          closeConnection = TRUE;
      }

      if(closeConnection && data->req.newurl) {
        /* Connection closed by server. Don't use it anymore */
        Curl_closesocket(conn, conn->sock[sockindex]);
        conn->sock[sockindex] = CURL_SOCKET_BAD;
        break;
      }
    } /* END READING RESPONSE PHASE */

    /* If we are supposed to continue and request a new URL, which basically
     * means the HTTP authentication is still going on so if the tunnel
     * is complete we start over in INIT state */
    if(data->req.newurl &&
       (TUNNEL_COMPLETE == conn->tunnel_state[sockindex])) {
      conn->tunnel_state[sockindex] = TUNNEL_INIT;
      infof(data, "TUNNEL_STATE switched to: %d\n",
            conn->tunnel_state[sockindex]);
    }

  } while(data->req.newurl);

  if(200 != data->req.httpcode) {
    if(closeConnection && data->req.newurl) {
      conn->bits.proxy_connect_closed = TRUE;
      infof(data, "Connect me again please\n");
    }
    else {
      free(data->req.newurl);
      data->req.newurl = NULL;
      /* failure, close this connection to avoid re-use */
      streamclose(conn, "proxy CONNECT failure");
      Curl_closesocket(conn, conn->sock[sockindex]);
      conn->sock[sockindex] = CURL_SOCKET_BAD;
    }

    /* to back to init state */
    conn->tunnel_state[sockindex] = TUNNEL_INIT;

    if(conn->bits.proxy_connect_closed)
      /* this is not an error, just part of the connection negotiation */
      return CURLE_OK;
    else {
      failf(data, "Received HTTP code %d from proxy after CONNECT",
            data->req.httpcode);
      return CURLE_RECV_ERROR;
    }
  }

  conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;

  /* If a proxy-authorization header was used for the proxy, then we should
     make sure that it isn't accidentally used for the document request
     after we've connected. So let's free and clear it here. */
  Curl_safefree(conn->allocptr.proxyuserpwd);
  conn->allocptr.proxyuserpwd = NULL;

  data->state.authproxy.done = TRUE;

  infof(data, "Proxy replied OK to CONNECT request\n");
  data->req.ignorebody = FALSE; /* put it (back) to non-ignore state */
  conn->bits.rewindaftersend = FALSE; /* make sure this isn't set for the
                                         document request  */
  return CURLE_OK;
}